

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

container_t *
containerptr_roaring_bitmap_add(roaring_bitmap_t *r,uint32_t val,uint8_t *type,int *index)

{
  ushort uVar1;
  int iVar2;
  uint16_t *puVar3;
  uint8_t *puVar4;
  bool bVar5;
  shared_container_t *sc;
  undefined8 *c;
  container_t *pcVar6;
  container_t *c_00;
  uint unaff_EBP;
  uint uVar7;
  int iVar8;
  ushort key;
  uint uVar9;
  uint8_t new_type;
  uint8_t local_39;
  uint *local_38;
  
  iVar2 = (r->high_low_container).size;
  key = (ushort)(val >> 0x10);
  if (((long)iVar2 == 0) || (puVar3 = (r->high_low_container).keys, puVar3[(long)iVar2 + -1] == key)
     ) {
    uVar7 = iVar2 - 1;
  }
  else {
    iVar8 = iVar2 + -1;
    uVar9 = 0;
    do {
      if (iVar8 < (int)uVar9) {
        uVar7 = ~uVar9;
        break;
      }
      uVar7 = uVar9 + iVar8 >> 1;
      uVar1 = *(ushort *)((long)puVar3 + (ulong)(uVar9 + iVar8 & 0xfffffffe));
      if (uVar1 < key) {
        uVar9 = uVar7 + 1;
        bVar5 = true;
        uVar7 = unaff_EBP;
      }
      else if (key < uVar1) {
        iVar8 = uVar7 - 1;
        bVar5 = true;
        uVar7 = unaff_EBP;
      }
      else {
        bVar5 = false;
      }
      unaff_EBP = uVar7;
    } while (bVar5);
  }
  if ((int)uVar7 < 0) {
    c = (undefined8 *)malloc(0x10);
    if (c == (undefined8 *)0x0) {
      c = (undefined8 *)0x0;
    }
    else {
      *c = 0;
      c[1] = 0;
    }
    c_00 = container_add(c,(uint16_t)val,'\x02',type);
    ra_insert_new_key_value_at(&r->high_low_container,~uVar7,key,c_00,*type);
    *index = ~uVar7;
  }
  else {
    if (iVar2 <= (int)(uVar7 & 0xffff)) {
      __assert_fail("i < ra->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1a95,"void ra_unshare_container_at_index(roaring_array_t *, uint16_t)");
    }
    uVar9 = uVar7 & 0xffff;
    puVar4 = (r->high_low_container).typecodes;
    sc = (shared_container_t *)(r->high_low_container).containers[uVar9];
    local_38 = (uint *)index;
    if (puVar4[uVar9] == '\x04') {
      sc = (shared_container_t *)shared_container_extract_copy(sc,puVar4 + uVar9);
    }
    *(shared_container_t **)((long)(r->high_low_container).containers + (ulong)(uVar9 * 8)) = sc;
    local_39 = (r->high_low_container).typecodes[uVar9];
    *type = local_39;
    c_00 = *(container_t **)((long)(r->high_low_container).containers + (ulong)(uVar9 * 8));
    pcVar6 = container_add(c_00,(uint16_t)val,local_39,&local_39);
    *local_38 = uVar7;
    if (pcVar6 != c_00) {
      container_free(c_00,*type);
      if ((r->high_low_container).size <= (int)uVar7) {
        __assert_fail("i < ra->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1a3a,
                      "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                     );
      }
      (r->high_low_container).containers[uVar7] = pcVar6;
      (r->high_low_container).typecodes[uVar7] = local_39;
      *type = local_39;
      c_00 = pcVar6;
    }
  }
  return c_00;
}

Assistant:

static inline container_t *containerptr_roaring_bitmap_add(
    roaring_bitmap_t *r, uint32_t val,
    uint8_t *type, int *index
){
    roaring_array_t *ra = &r->high_low_container;

    uint16_t hb = val >> 16;
    const int i = ra_get_index(ra, hb);
    if (i >= 0) {
        ra_unshare_container_at_index(ra, i);
        container_t *c = ra_get_container_at_index(ra, i, type);
        uint8_t new_type = *type;
        container_t *c2 = container_add(c, val & 0xFFFF, *type, &new_type);
        *index = i;
        if (c2 != c) {
            container_free(c, *type);
            ra_set_container_at_index(ra, i, c2, new_type);
            *type = new_type;
            return c2;
        } else {
            return c;
        }
    } else {
        array_container_t *new_ac = array_container_create();
        container_t *c = container_add(new_ac, val & 0xFFFF,
                                       ARRAY_CONTAINER_TYPE, type);
        // we could just assume that it stays an array container
        ra_insert_new_key_value_at(ra, -i - 1, hb, c, *type);
        *index = -i - 1;
        return c;
    }
}